

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O0

ssize_t __thiscall
net_uv::KCPSocket::send(KCPSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  undefined4 extraout_var_00;
  undefined7 uVar2;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  bool ok;
  void *userdata_local;
  SocketSendCall call_local;
  int len_local;
  char *data_local;
  KCPSocket *this_local;
  
  if (this->m_kcp == (ikcpcb *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (0x800 < (int)__buf) {
      __assert_fail("len <= KCP_MAX_MSG_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/KCPSocket.cpp"
                    ,0xbe,
                    "virtual bool net_uv::KCPSocket::send(char *, int, SocketSendCall, void *)");
    }
    iVar1 = ikcp_send(this->m_kcp,(char *)CONCAT44(in_register_00000034,__fd),(int)__buf);
    this_local._7_1_ = -1 < iVar1;
    uVar2 = (undefined7)(CONCAT44(extraout_var_00,iVar1) >> 8);
    if (__n != 0) {
      (*(code *)__n)(CONCAT44(in_register_00000084,__flags));
      uVar2 = extraout_var;
    }
    this = (KCPSocket *)CONCAT71(uVar2,this_local._7_1_);
  }
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool KCPSocket::send(char* data, int len, SocketSendCall call, void* userdata)
{
	if (m_kcp == NULL)
	{
		return false;
	}
	assert(len <= KCP_MAX_MSG_SIZE);
	bool ok = ikcp_send(m_kcp, data, len) >= 0;

	if (call) call(userdata);

	return ok;
}